

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper4.cpp
# Opt level: O2

void cpp_wrapper_static_open_close
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int value)

{
  ion_dictionary_id_t iVar1;
  int32_t actual;
  int32_t actual_00;
  ion_dictionary_size_t iVar2;
  ion_dictionary_type_t iVar3;
  ion_dictionary_parent_t *piVar4;
  ion_dictionary_config_info_t config_info;
  ion_dictionary_config_info_t config_info_00;
  ion_dictionary_config_info_t config_info_01;
  ion_dictionary_config_info_t config_info_02;
  ion_dictionary_config_info_t config_info_03;
  ion_dictionary_config_info_t config_info_04;
  ion_dictionary_config_info_t config_info_05;
  ulong uVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  planck_unit_result_t pVar21;
  int iVar22;
  Dictionary<int,_int> *pDVar23;
  undefined4 uStack_10c;
  uint uStack_f4;
  undefined4 uStack_ec;
  uint uStack_d4;
  undefined4 uStack_cc;
  uint uStack_b4;
  undefined4 uStack_ac;
  uint uStack_94;
  undefined4 uStack_8c;
  uint uStack_74;
  undefined4 uStack_6c;
  uint uStack_54;
  undefined4 uStack_4c;
  uint uStack_34;
  
  piVar4 = (dict->dict).instance;
  iVar1 = piVar4->id;
  actual = (piVar4->record).key_size;
  uVar19 = piVar4->key_type;
  uVar20 = (piVar4->record).key_size;
  config_info_05.key_size = uVar20;
  config_info_05.type = uVar19;
  uVar17 = piVar4->key_type;
  uVar18 = (piVar4->record).key_size;
  config_info_04.key_size = uVar18;
  config_info_04.type = uVar17;
  uVar15 = piVar4->key_type;
  uVar16 = (piVar4->record).key_size;
  config_info_03.key_size = uVar16;
  config_info_03.type = uVar15;
  uVar13 = piVar4->key_type;
  uVar14 = (piVar4->record).key_size;
  config_info_02.key_size = uVar14;
  config_info_02.type = uVar13;
  uVar11 = piVar4->key_type;
  uVar12 = (piVar4->record).key_size;
  config_info_01.key_size = uVar12;
  config_info_01.type = uVar11;
  uVar9 = piVar4->key_type;
  uVar10 = (piVar4->record).key_size;
  config_info_00.key_size = uVar10;
  config_info_00.type = uVar9;
  uVar7 = piVar4->key_type;
  uVar8 = (piVar4->record).key_size;
  config_info.key_size = uVar8;
  config_info.type = uVar7;
  actual_00 = (piVar4->record).value_size;
  iVar2 = dict->dict_size;
  iVar3 = piVar4->type;
  cpp_wrapper_insert(tc,dict,key,value,'\0');
  pDVar23 = dict;
  cpp_wrapper_get(tc,dict,key,value,'\0',1);
  iVar22 = Dictionary<int,_int>::close(dict,(int)pDVar23);
  pVar21 = planck_unit_assert_int_are_equal
                     (tc,0,(int)(char)iVar22,0x44,
                      "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                     );
  if (pVar21 != '\0') {
    switch(iVar3) {
    case dictionary_type_bpp_tree_t:
      uStack_34 = uStack_34 & 0xffffff00;
      uVar5 = CONCAT44(uStack_4c,iVar1) & 0xffffff00ffffffff;
      config_info.dictionary_size = iVar2;
      config_info.value_size = actual_00;
      lVar6 = (ulong)uStack_34 << 0x20;
      config_info.id = (int)uVar5;
      config_info.use_type = (char)(uVar5 >> 0x20);
      config_info._5_3_ = (int3)(uVar5 >> 0x28);
      config_info.dictionary_type = (int)lVar6;
      config_info.dictionary_status = (char)((ulong)lVar6 >> 0x20);
      config_info._29_3_ = (int3)((ulong)lVar6 >> 0x28);
      dict = &BppTree<int,_int>::openDictionary(config_info,0,0)->super_Dictionary<int,_int>;
      break;
    case dictionary_type_flat_file_t:
      uStack_54 = uStack_54 & 0xffffff00;
      uVar5 = CONCAT44(uStack_6c,iVar1) & 0xffffff00ffffffff;
      config_info_03.dictionary_size = iVar2;
      config_info_03.value_size = actual_00;
      config_info_03._28_4_ = uStack_54;
      config_info_03.dictionary_type = 1;
      config_info_03.id = (int)uVar5;
      config_info_03.use_type = (char)(uVar5 >> 0x20);
      config_info_03._5_3_ = (int3)(uVar5 >> 0x28);
      dict = &FlatFile<int,_int>::openDictionary(config_info_03,0,0)->super_Dictionary<int,_int>;
      break;
    case dictionary_type_open_address_file_hash_t:
      uStack_b4 = uStack_b4 & 0xffffff00;
      uVar5 = CONCAT44(uStack_cc,iVar1) & 0xffffff00ffffffff;
      config_info_01.dictionary_size = iVar2;
      config_info_01.value_size = actual_00;
      config_info_01._28_4_ = uStack_b4;
      config_info_01.dictionary_type = 2;
      config_info_01.id = (int)uVar5;
      config_info_01.use_type = (char)(uVar5 >> 0x20);
      config_info_01._5_3_ = (int3)(uVar5 >> 0x28);
      dict = &OpenAddressFileHash<int,_int>::openDictionary(config_info_01,0,0)->
              super_Dictionary<int,_int>;
      break;
    case dictionary_type_open_address_hash_t:
      uStack_94 = uStack_94 & 0xffffff00;
      uVar5 = CONCAT44(uStack_ac,iVar1) & 0xffffff00ffffffff;
      config_info_02.dictionary_size = iVar2;
      config_info_02.value_size = actual_00;
      config_info_02._28_4_ = uStack_94;
      config_info_02.dictionary_type = 3;
      config_info_02.id = (int)uVar5;
      config_info_02.use_type = (char)(uVar5 >> 0x20);
      config_info_02._5_3_ = (int3)(uVar5 >> 0x28);
      dict = &OpenAddressHash<int,_int>::openDictionary(config_info_02,0,0)->
              super_Dictionary<int,_int>;
      break;
    case dictionary_type_skip_list_t:
      uStack_74 = uStack_74 & 0xffffff00;
      uVar5 = CONCAT44(uStack_8c,iVar1) & 0xffffff00ffffffff;
      config_info_00.dictionary_size = iVar2;
      config_info_00.value_size = actual_00;
      config_info_00._28_4_ = uStack_74;
      config_info_00.dictionary_type = 4;
      config_info_00.id = (int)uVar5;
      config_info_00.use_type = (char)(uVar5 >> 0x20);
      config_info_00._5_3_ = (int3)(uVar5 >> 0x28);
      dict = &SkipList<int,_int>::openDictionary(config_info_00,0,0)->super_Dictionary<int,_int>;
      break;
    case dictionary_type_linear_hash_t:
      uStack_d4 = uStack_d4 & 0xffffff00;
      uVar5 = CONCAT44(uStack_ec,iVar1) & 0xffffff00ffffffff;
      config_info_04.dictionary_size = iVar2;
      config_info_04.value_size = actual_00;
      config_info_04._28_4_ = uStack_d4;
      config_info_04.dictionary_type = 5;
      config_info_04.id = (int)uVar5;
      config_info_04.use_type = (char)(uVar5 >> 0x20);
      config_info_04._5_3_ = (int3)(uVar5 >> 0x28);
      dict = &LinearHash<int,_int>::openDictionary(config_info_04,0,0)->super_Dictionary<int,_int>;
      break;
    case dictionary_type_error_t:
      uStack_f4 = uStack_f4 & 0xffffff00;
      uVar5 = CONCAT44(uStack_10c,iVar1) & 0xffffff00ffffffff;
      config_info_05.dictionary_size = iVar2;
      config_info_05.value_size = actual_00;
      config_info_05._28_4_ = uStack_f4;
      config_info_05.dictionary_type = 6;
      config_info_05.id = (int)uVar5;
      config_info_05.use_type = (char)(uVar5 >> 0x20);
      config_info_05._5_3_ = (int3)(uVar5 >> 0x28);
      dict = &SkipList<int,_int>::openDictionary(config_info_05,0,0)->super_Dictionary<int,_int>;
      (dict->last_status).error = '\x12';
    }
    pVar21 = planck_unit_assert_int_are_equal
                       (tc,0,(int)(dict->last_status).error,0x72,
                        "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                       );
    if (((pVar21 != '\0') &&
        (pVar21 = planck_unit_assert_int_are_equal
                            (tc,(((dict->dict).instance)->record).key_size,actual,0x73,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                            ), pVar21 != '\0')) &&
       (pVar21 = planck_unit_assert_int_are_equal
                           (tc,(((dict->dict).instance)->record).value_size,actual_00,0x74,
                            "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                           ), pVar21 != '\0')) {
      cpp_wrapper_get(tc,dict,key,value,'\0',1);
      Dictionary<int,_int>::~Dictionary(dict);
      operator_delete(dict);
      return;
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_static_open_close(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key,
	int value
) {
	ion_err_t				error;
	ion_dictionary_id_t		gdict_id	= dict->dict.instance->id;
	ion_key_size_t			key_size	= dict->dict.instance->record.key_size;
	ion_value_size_t		val_size	= dict->dict.instance->record.value_size;
	ion_key_type_t			key_type	= dict->dict.instance->key_type;
	ion_dictionary_size_t	dict_size	= dict->dict_size;
	ion_dictionary_type_t	dict_type	= dict->dict.instance->type;

	/* Insert test record so we can check data integrity after we close/open */
	cpp_wrapper_insert(tc, dict, key, value, boolean_false);

	/* Check the test record */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);

	error = dict->close();

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	ion_dictionary_config_info_t config = {
		gdict_id, 0, key_type, key_size, val_size, dict_size, dict_type
	};

	int type = 0;

	switch (dict_type) {
		case dictionary_type_bpp_tree_t: {
			dict = BppTree<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_flat_file_t: {
			dict = FlatFile<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_skip_list_t: {
			dict = SkipList<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_hash_t: {
			dict = OpenAddressHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_file_hash_t: {
			dict = OpenAddressFileHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_linear_hash_t: {
			dict = LinearHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_error_t: {
			dict					= SkipList<int, int>::openDictionary(config, type, type);
			dict->last_status.error = err_uninitialized;
			break;
		}
	}

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, dict->last_status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.key_size, key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.value_size, val_size);

	/* Check the test record */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);

	delete dict;
}